

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::EvaluateResponse>::construct
          (BasicTypeInfo<dap::EvaluateResponse> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::EvaluateResponse> *this_local;
  
  memset(ptr,0,0x118);
  EvaluateResponse::EvaluateResponse((EvaluateResponse *)ptr);
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }